

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O1

size_t anurbs::HilbertCurve<3L>::index_at(size_t m,VectorU *p)

{
  bool bVar1;
  sbyte sVar2;
  Index c;
  size_t sVar3;
  Index j;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if ((long)(m - 1) < 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    uVar6 = 0;
    uVar11 = 0;
    uVar13 = m - 1;
    do {
      lVar4 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + ((ulong)(((p->
                                  super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>
                                  ).m_storage.m_data.array[lVar4] >> (uVar13 & 0x3f) & 1) != 0) <<
                        ((byte)lVar4 & 0x3f));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      sVar2 = 0;
      if (uVar11 + 1 != 3) {
        sVar2 = (sbyte)(uVar11 + 1);
      }
      uVar9 = ((uint)((uVar7 ^ uVar6) >> sVar2) | (int)(uVar7 ^ uVar6) << (3U - sVar2 & 0x1f)) & 7;
      lVar4 = 1;
      uVar7 = (ulong)uVar9;
      do {
        uVar12 = uVar7;
        uVar10 = (ulong)(uVar9 >> ((byte)lVar4 & 0x3f));
        uVar7 = uVar10 ^ uVar12;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar8 = 0;
      if (uVar10 != uVar12) {
        uVar8 = uVar7 - 1 >> 1 ^ uVar7 - 1 & 0xfffffffffffffffe;
      }
      uVar6 = uVar6 ^ ((uint)(uVar8 >> (3U - sVar2 & 0x3f)) | (uint)(uVar8 << sVar2)) & 7;
      sVar3 = d(uVar7);
      uVar11 = (uVar11 + sVar3 + 1) % 3;
      sVar5 = sVar5 << 3 | uVar7;
      bVar1 = 0 < (long)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar1);
  }
  return sVar5;
}

Assistant:

static size_t index_at(const size_t m, const VectorU p) noexcept
    {
        // FIXME: check m

        size_t h = 0;
        size_t ve = 0;
        size_t vd = 0;

        for (Index i = m - 1; i > -1; i--) {
            size_t s = 0;

            for (Index j = 0; j < TDimension; j++) {
                s += bit(p[j], i) << j;
            }

            const size_t l = t(ve, vd, s);
            const size_t w = inverse_gc(l);

            ve = ve ^ (rol(e(w), vd + 1));
            vd = (vd + d(w) + 1) % TDimension;
            h = (h << TDimension) | w;
        }

        return h;
    }